

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::QualifiedOneofCaseConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  OneofDescriptor *pOVar1;
  Descriptor *d;
  string local_e8;
  string qualification;
  AlphaNum local_a8;
  AlphaNum local_78;
  size_type local_48;
  pointer local_40;
  
  pOVar1 = FieldDescriptor::containing_oneof((FieldDescriptor *)this);
  if (pOVar1 != (OneofDescriptor *)0x0) {
    QualifiedClassName_abi_cxx11_(&qualification,*(cpp **)(this + 0x20),d);
    local_a8.piece_._M_len = qualification._M_string_length;
    local_a8.piece_._M_str = qualification._M_dataplus._M_p;
    local_78.piece_ = absl::lts_20240722::NullSafeStringView("::");
    OneofCaseConstantName_abi_cxx11_(&local_e8,this,(FieldDescriptor *)local_78.piece_._M_str);
    local_48 = local_e8._M_string_length;
    local_40 = local_e8._M_dataplus._M_p;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_a8,&local_78);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&qualification);
    return __return_storage_ptr__;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
             ,0x23e,0x19,"field->containing_oneof()");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a8);
}

Assistant:

std::string QualifiedOneofCaseConstantName(const FieldDescriptor* field) {
  ABSL_DCHECK(field->containing_oneof());
  const std::string qualification =
      QualifiedClassName(field->containing_type());
  return absl::StrCat(qualification, "::", OneofCaseConstantName(field));
}